

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.hpp
# Opt level: O0

void __thiscall
cpptrace::exception_with_message::~exception_with_message(exception_with_message *this)

{
  exception_with_message *this_local;
  
  (this->super_lazy_exception).super_exception = (exception)&PTR__exception_with_message_003c80c8;
  std::__cxx11::string::~string((string *)&this->user_message);
  lazy_exception::~lazy_exception(&this->super_lazy_exception);
  return;
}

Assistant:

class CPPTRACE_EXPORT exception_with_message : public lazy_exception {
        mutable std::string user_message;

    public:
        explicit exception_with_message(
            std::string&& message_arg,
            raw_trace&& trace = detail::get_raw_trace_and_absorb()
        ) noexcept : lazy_exception(std::move(trace)), user_message(std::move(message_arg)) {}

        const char* message() const noexcept override;
    }